

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O3

uint32_t aeron::BufferBuilder::findSuitableCapacity
                   (uint32_t currentCapacity,uint32_t requiredCapacity)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  SourcedException *this;
  char *pcVar5;
  char *pcVar6;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar4 = (ulong)currentCapacity;
  while( true ) {
    uVar2 = (uint)(uVar4 >> 1);
    uVar3 = uVar2 + currentCapacity;
    uVar4 = (ulong)uVar3;
    if ((!(bool)(~CARRY4(uVar2,currentCapacity) & uVar3 < 0xfffffff8)) &&
       (uVar4 = 0xfffffff7, currentCapacity == 0xfffffff7)) break;
    currentCapacity = (uint32_t)uVar4;
    if (requiredCapacity <= currentCapacity) {
      return currentCapacity;
    }
  }
  this = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_a0,0xfffffff7);
  std::operator+(&local_40,"max capacity reached: ",&local_a0);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,
             "static std::uint32_t aeron::BufferBuilder::findSuitableCapacity(std::uint32_t, std::uint32_t)"
             ,"");
  pcVar6 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/BufferBuilder.h"
  ;
  pcVar5 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
  do {
    pcVar5 = pcVar5 + 1;
    pcVar1 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
  } while (*pcVar5 == *pcVar1);
  std::__cxx11::string::string((string *)&local_60,pcVar6 + (*pcVar1 == '/'),&local_a1);
  util::SourcedException::SourcedException(this,&local_40,&local_80,&local_60,0x68);
  *(undefined ***)this = &PTR__SourcedException_00162b00;
  __cxa_throw(this,&util::IllegalStateException::typeinfo,util::SourcedException::~SourcedException)
  ;
}

Assistant:

inline static std::uint32_t findSuitableCapacity(std::uint32_t currentCapacity, std::uint32_t requiredCapacity)
    {
        std::uint32_t capacity = currentCapacity;

        do
        {
            const std::uint32_t newCapacity = capacity + (capacity >> 1);

            if (newCapacity < capacity || newCapacity > BUFFER_BUILDER_MAX_CAPACITY)
            {
                if (capacity == BUFFER_BUILDER_MAX_CAPACITY)
                {
                    throw util::IllegalStateException(
                        "max capacity reached: " + std::to_string(BUFFER_BUILDER_MAX_CAPACITY), SOURCEINFO);
                }

                capacity = BUFFER_BUILDER_MAX_CAPACITY;
            }
            else
            {
                capacity = newCapacity;
            }
        }
        while (capacity < requiredCapacity);

        return capacity;
    }